

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_errors.c
# Opt level: O0

void SUNAbortErrHandlerFn
               (int line,char *func,char *file,char *msg,SUNErrCode err_code,void *err_user_data,
               SUNContext sunctx)

{
  char *pcVar1;
  char *in_RCX;
  char *in_RSI;
  SUNErrCode in_R8D;
  undefined8 in_R9;
  char *file_and_line;
  undefined4 in_stack_ffffffffffffffd8;
  int line_00;
  
  SUNLogger_Flush((SUNLogger)CONCAT44(in_R8D,in_stack_ffffffffffffffd8),
                  (SUNLogLevel)((ulong)in_R9 >> 0x20));
  pcVar1 = sunCombineFileAndLine
                     ((int)((ulong)in_RCX >> 0x20),
                      (char *)CONCAT44(in_R8D,in_stack_ffffffffffffffd8));
  if (in_RCX == (char *)0x0) {
    in_RCX = SUNGetErrMsg(in_R8D);
  }
  SUNLogger_QueueMsg(*(SUNLogger *)((long)err_user_data + 0x10),SUN_LOGLEVEL_ERROR,pcVar1,in_RSI,
                     in_RCX);
  line_00 = (int)((ulong)in_RCX >> 0x20);
  free(pcVar1);
  pcVar1 = sunCombineFileAndLine(line_00,(char *)CONCAT44(in_R8D,in_stack_ffffffffffffffd8));
  SUNLogger_QueueMsg(*(SUNLogger *)((long)err_user_data + 0x10),SUN_LOGLEVEL_ERROR,pcVar1,
                     "SUNAbortErrHandlerFn",
                     "SUNAbortErrHandler: Calling abort now, use a different error handler to avoid program termination.\n"
                    );
  free(pcVar1);
  abort();
}

Assistant:

void SUNAbortErrHandlerFn(int line, const char* func, const char* file,
                          SUNDIALS_MAYBE_UNUSED const char* msg,
                          SUNDIALS_MAYBE_UNUSED SUNErrCode err_code,
                          SUNDIALS_MAYBE_UNUSED void* err_user_data,
                          SUNContext sunctx)
{
  /* Flush all buffered logging messages now before we abort */
  SUNLogger_Flush(sunctx->logger, SUN_LOGLEVEL_ALL);

  char* file_and_line = sunCombineFileAndLine(line, file);
  if (msg == NULL) { msg = SUNGetErrMsg(err_code); }
  SUNLogger_QueueMsg(sunctx->logger, SUN_LOGLEVEL_ERROR, file_and_line, func,
                     msg);
  free(file_and_line);
  /* It is convenient to have the exit message point to the message line,
     so we add 1 to the line number. As such, do not separate the following lines! */
  file_and_line = sunCombineFileAndLine(__LINE__ + 1, __FILE__);
  SUNLogger_QueueMsg(sunctx->logger, SUN_LOGLEVEL_ERROR, file_and_line, __func__,
                     "SUNAbortErrHandler: Calling abort now, use a different "
                     "error handler to avoid program termination.\n");
  free(file_and_line);
  abort();
}